

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O3

void __thiscall MatroskaDemuxer::readClose(MatroskaDemuxer *this)

{
  AVPacket *pAVar1;
  uint8_t *puVar2;
  Track *pTVar3;
  int iVar4;
  _Elt_pointer ppAVar5;
  long lVar6;
  
  if (this->writing_app != (char *)0x0) {
    operator_delete__(this->writing_app);
  }
  if (this->muxing_app != (char *)0x0) {
    operator_delete__(this->muxing_app);
  }
  ppAVar5 = (this->packets).c.super__Deque_base<AVPacket_*,_std::allocator<AVPacket_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  if ((this->packets).c.super__Deque_base<AVPacket_*,_std::allocator<AVPacket_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur != ppAVar5) {
    do {
      pAVar1 = *ppAVar5;
      puVar2 = pAVar1->data;
      if (puVar2 != (uint8_t *)0x0) {
        operator_delete__(puVar2);
      }
      operator_delete(pAVar1,0x50);
      std::deque<AVPacket_*,_std::allocator<AVPacket_*>_>::pop_front(&(this->packets).c);
      ppAVar5 = (this->packets).c.super__Deque_base<AVPacket_*,_std::allocator<AVPacket_*>_>._M_impl
                .super__Deque_impl_data._M_start._M_cur;
    } while ((this->packets).c.super__Deque_base<AVPacket_*,_std::allocator<AVPacket_*>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur != ppAVar5);
  }
  iVar4 = (this->super_IOContextDemuxer).num_tracks;
  if (0 < iVar4) {
    lVar6 = 0;
    do {
      pTVar3 = (this->super_IOContextDemuxer).tracks[lVar6];
      if (pTVar3 != (Track *)0x0) {
        operator_delete__(pTVar3);
        iVar4 = (this->super_IOContextDemuxer).num_tracks;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar4);
  }
  return;
}

Assistant:

void MatroskaDemuxer::readClose()
{
    delete[] writing_app;
    delete[] muxing_app;
    while (!packets.empty())
    {
        const AVPacket *pkt = packets.front();
        delete[] pkt->data;
        delete pkt;
        packets.pop();
    }
    for (int i = 0; i < num_tracks; i++) delete[] reinterpret_cast<char *>(tracks[i]);
}